

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O3

uint16_t icu_63::getAlgName(AlgorithmicRange *range,uint32_t code,UCharNameChoice nameChoice,
                           char *buffer,uint16_t bufferLength)

{
  byte bVar1;
  long lVar2;
  uint16_t uVar3;
  ulong uVar4;
  char cVar5;
  ushort uVar6;
  char *s;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  char cVar10;
  uint16_t indexes [8];
  
  if ((nameChoice & ~U_EXTENDED_CHAR_NAME) == U_UNICODE_CHAR_NAME) {
    uVar4 = (ulong)code;
    if (range->type == '\x01') {
      bVar1 = range->variant;
      s = (char *)((long)&range[1].start + (ulong)bVar1 * 2 + 1);
      cVar5 = *(char *)((long)&range[1].start + (ulong)bVar1 * 2);
      lVar7 = 0;
      if (cVar5 != '\0') {
        do {
          if (bufferLength == 0) {
            bufferLength = 0;
          }
          else {
            *buffer = cVar5;
            buffer = buffer + 1;
            bufferLength = bufferLength - 1;
          }
          cVar5 = s[lVar7];
          lVar7 = lVar7 + 1;
        } while (cVar5 != '\0');
        s = s + lVar7;
      }
      uVar3 = writeFactorSuffix((uint16_t *)(range + 1),(ushort)bVar1,s,code - range->start,indexes,
                                (char **)0x0,(char **)0x0,buffer,bufferLength);
      return (short)lVar7 + uVar3;
    }
    if (range->type == '\0') {
      lVar7 = 0;
      cVar5 = (char)range[1].start;
      while (cVar5 != '\0') {
        if (bufferLength == 0) {
          bufferLength = 0;
        }
        else {
          *buffer = cVar5;
          buffer = buffer + 1;
          bufferLength = bufferLength - 1;
        }
        lVar2 = lVar7 + 1;
        lVar7 = lVar7 + 1;
        cVar5 = *(char *)((long)&range[1].start + lVar2);
      }
      uVar6 = (ushort)range->variant;
      uVar8 = (ulong)uVar6;
      if (uVar6 < bufferLength) {
        buffer[uVar8] = '\0';
      }
      if (uVar8 != 0) {
        do {
          uVar8 = uVar8 - 1;
          if (uVar8 < bufferLength) {
            uVar9 = (uint)uVar4 & 0xf;
            cVar5 = (char)uVar9;
            cVar10 = cVar5 + '7';
            if (uVar9 < 10) {
              cVar10 = cVar5 + '0';
            }
            buffer[uVar8] = cVar10;
          }
          uVar4 = uVar4 >> 4;
        } while (uVar8 != 0);
      }
      return (short)lVar7 + uVar6;
    }
  }
  if (bufferLength != 0) {
    *buffer = '\0';
  }
  return 0;
}

Assistant:

static uint16_t
getAlgName(AlgorithmicRange *range, uint32_t code, UCharNameChoice nameChoice,
        char *buffer, uint16_t bufferLength) {
    uint16_t bufferPos=0;

    /* Only the normative character name can be algorithmic. */
    if(nameChoice!=U_UNICODE_CHAR_NAME && nameChoice!=U_EXTENDED_CHAR_NAME) {
        /* zero-terminate */
        if(bufferLength>0) {
            *buffer=0;
        }
        return 0;
    }

    switch(range->type) {
    case 0: {
        /* name = prefix hex-digits */
        const char *s=(const char *)(range+1);
        char c;

        uint16_t i, count;

        /* copy prefix */
        while((c=*s++)!=0) {
            WRITE_CHAR(buffer, bufferLength, bufferPos, c);
        }

        /* write hexadecimal code point value */
        count=range->variant;

        /* zero-terminate */
        if(count<bufferLength) {
            buffer[count]=0;
        }

        for(i=count; i>0;) {
            if(--i<bufferLength) {
                c=(char)(code&0xf);
                if(c<10) {
                    c+='0';
                } else {
                    c+='A'-10;
                }
                buffer[i]=c;
            }
            code>>=4;
        }

        bufferPos+=count;
        break;
    }
    case 1: {
        /* name = prefix factorized-elements */
        uint16_t indexes[8];
        const uint16_t *factors=(const uint16_t *)(range+1);
        uint16_t count=range->variant;
        const char *s=(const char *)(factors+count);
        char c;

        /* copy prefix */
        while((c=*s++)!=0) {
            WRITE_CHAR(buffer, bufferLength, bufferPos, c);
        }

        bufferPos+=writeFactorSuffix(factors, count,
                                     s, code-range->start, indexes, NULL, NULL, buffer, bufferLength);
        break;
    }
    default:
        /* undefined type */
        /* zero-terminate */
        if(bufferLength>0) {
            *buffer=0;
        }
        break;
    }

    return bufferPos;
}